

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O2

void send_message(int id_destination,int id_message)

{
  int iVar1;
  undefined2 uVar2;
  undefined2 uVar3;
  void *__buf;
  undefined4 uVar4;
  int __fd;
  mapped_type *pmVar5;
  mapped_type *pmVar6;
  ssize_t sVar7;
  uchar extraout_RDX [8];
  sockaddr_in addr;
  int id_destination_local;
  string str_addr;
  
  id_destination_local = id_destination;
  str_addr._M_dataplus._M_p._0_4_ = id_destination;
  str_addr._M_dataplus._M_p._4_4_ = id_message;
  pmVar5 = std::
           map<std::pair<int,_int>,_std::pair<void_*,_int>,_std::less<std::pair<int,_int>_>,_std::allocator<std::pair<const_std::pair<int,_int>,_std::pair<void_*,_int>_>_>_>
           ::operator[](&MM,(key_type *)&str_addr);
  __fd = socket_fd;
  __buf = pmVar5->first;
  iVar1 = pmVar5->second;
  pmVar6 = std::
           map<int,_sockaddr_in,_std::less<int>,_std::allocator<std::pair<const_int,_sockaddr_in>_>_>
           ::operator[](&connections,&id_destination_local);
  sVar7 = sendto(__fd,__buf,(long)iVar1,0,(sockaddr *)pmVar6,0x10);
  if (sVar7 < 0) {
    perror("Send");
  }
  else {
    pmVar6 = std::
             map<int,_sockaddr_in,_std::less<int>,_std::allocator<std::pair<const_int,_sockaddr_in>_>_>
             ::operator[](&connections,&id_destination_local);
    uVar2 = pmVar6->sin_family;
    uVar3 = pmVar6->sin_port;
    uVar4 = pmVar6->sin_addr;
    addr.sin_addr.s_addr = uVar4;
    addr.sin_port = uVar3;
    addr.sin_family = uVar2;
    addr.sin_zero[0] = extraout_RDX[0];
    addr.sin_zero[1] = extraout_RDX[1];
    addr.sin_zero[2] = extraout_RDX[2];
    addr.sin_zero[3] = extraout_RDX[3];
    addr.sin_zero[4] = extraout_RDX[4];
    addr.sin_zero[5] = extraout_RDX[5];
    addr.sin_zero[6] = extraout_RDX[6];
    addr.sin_zero[7] = extraout_RDX[7];
    pack_address_abi_cxx11_(&str_addr,addr);
    std::__cxx11::string::~string((string *)&str_addr);
  }
  return;
}

Assistant:

void send_message(int id_destination, int id_message) {
    std::pair<void*, int> send_buf = MM[{id_destination, id_message}];
    //fprintf(stderr, "Send message: %d %d\n", id_destination, id_message);
    //fprintf(stderr, "Type: %d\n", ntohl(((uint32_t*)send_buf.first)[0]));
    ssize_t size = sendto(socket_fd, send_buf.first, (size_t)send_buf.second, 0,
                          (struct sockaddr *)&connections[id_destination], sizeof(struct sockaddr_in));
    if (size < 0) {
        perror("Send");
        return;
    }
    std::string str_addr = pack_address(connections[id_destination]);
}